

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_quit(connectdata *conn)

{
  CURLcode CVar1;
  CURLcode result;
  connectdata *conn_local;
  
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
  if (CVar1 == CURLE_OK) {
    state(conn,POP3_QUIT);
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_quit(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Send the QUIT command */
  result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", "QUIT");

  if(!result)
    state(conn, POP3_QUIT);

  return result;
}